

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutlineHandler.cpp
# Opt level: O1

void __thiscall
OutlineHandler::run(OutlineHandler *this,Id *id,
                   optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                   *paramsOpt)

{
  pointer pDVar1;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type this_01;
  Ch *__s;
  File *file;
  DocumentSymbol *symbol;
  pointer this_02;
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *__range1;
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> symbols;
  string uri;
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> local_d8;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_b8;
  Stack<rapidjson::CrtAllocator> local_78;
  string local_40;
  
  if (paramsOpt->is_some == false) {
    sendError(id,InvalidParams,"missing params",(Value *)0x0);
    return;
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)paramsOpt,"textDocument");
  this_01 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_00,"uri");
  __s = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(this_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,__s,(allocator<char> *)&local_b8);
  file = FileManager::get(&local_40);
  if (file == (File *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"!!! Null file !!!\n",0x12);
    sendNullResult(id);
    goto LAB_0019e344;
  }
  local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (file->type == Bib) {
    getOutlineForBibFile((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)&local_78,file);
LAB_0019e1be:
    local_b8.level_stack_.ownAllocator_ =
         (CrtAllocator *)
         local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_b8.level_stack_.allocator_ =
         (CrtAllocator *)
         local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_b8.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                   local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_78.allocator_;
    local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_78.ownAllocator_;
    local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_78.stack_;
    local_78.allocator_ = (CrtAllocator *)0x0;
    local_78.ownAllocator_ = (CrtAllocator *)0x0;
    local_78.stack_ = (char *)0x0;
    std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::~vector
              ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)&local_b8);
    std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::~vector
              ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)&local_78);
    local_b8.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_78;
    local_78.stack_ = (char *)0x0;
    local_78.stackTop_ = (char *)0x0;
    local_78.allocator_ = (CrtAllocator *)0x0;
    local_78.ownAllocator_ = (CrtAllocator *)0x0;
    local_78.stackEnd_ = (char *)0x0;
    local_78.initialCapacity_ = 0x100;
    local_b8.level_stack_.allocator_ = (CrtAllocator *)0x0;
    local_b8.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_b8.level_stack_.stack_ = (char *)0x0;
    local_b8.level_stack_.stackTop_ = (char *)0x0;
    local_b8.level_stack_.stackEnd_ = (char *)0x0;
    local_b8.level_stack_.initialCapacity_ = 0x200;
    local_b8.maxDecimalPlaces_ = 0x144;
    local_b8.hasRoot_ = false;
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartObject(&local_b8);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_b8,"jsonrpc",7,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_b8,"2.0",3,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_b8,"id",2,false);
    Id::writeId(id,&local_b8);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_b8,"result",6,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(&local_b8);
    pDVar1 = local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_02 = local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl
                .super__Vector_impl_data._M_start;
      do {
        DocumentSymbol::reflect((DocumentSymbol *)this_02,&local_b8);
        this_02 = this_02 + 1;
      } while (this_02 != pDVar1);
    }
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(&local_b8,0);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndObject(&local_b8,0);
    sendMessage((StringBuffer *)&local_78);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_b8.level_stack_);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_78);
  }
  else {
    if (file->type == Tex) {
      getOutlineForLatexFile
                ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)&local_78,file);
      goto LAB_0019e1be;
    }
    sendNullResult(id);
  }
  std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::~vector(&local_d8);
LAB_0019e344:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OutlineHandler::run (Id &id, optional<Value> &paramsOpt) {
    if (!paramsOpt) {
        sendError(&id, ResponseHandler::ErrorCode::InvalidParams, "missing params");
        return;
    }

    Value &params = *paramsOpt; // TODO: Make function

    Value &textDocumentIdentifier = params["textDocument"];
    string uri = textDocumentIdentifier["uri"].GetString();

    File *file = FileManager::get(uri);
    if (file == nullptr) {
        std::cerr << "!!! Null file !!!\n";
        sendNullResult(id);
        return;
    }

    vector<DocumentSymbol> symbols;
    switch (file->type) {
        case File::Type::Tex:
            symbols = getOutlineForLatexFile(*file);
            break;
        case File::Type::Bib:
            symbols = getOutlineForBibFile(*file);
            break;
        default:
            sendNullResult(id);
            return;
    }

    INIT_WRITER
    ADD_ID(id);
    writer.Key("result");
    writer.StartArray();
    for (auto &symbol : symbols) {
        symbol.reflect(writer);
    }
    writer.EndArray();
    SEND_MESSAGE
}